

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O2

void ApprovalTests::CartesianProduct::Detail::
     for_each_impl<std::tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>,ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::print_input,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>
               (undefined8 *t,print_input *f)

{
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[8]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[7]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[6]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[5]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[4]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[3]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[2]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()
            (f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t[1]);
  TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  print_input::operator()(f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*t)
  ;
  return;
}

Assistant:

void for_each_impl(Tuple&& t, F&& f, index_sequence<Is...>)
            {
                (void)std::initializer_list<int>{
                    (std::forward<F>(f)(std::get<Is>(std::forward<Tuple>(t))), 0)...};
            }